

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_addstr(wchar_t n,wchar_t a,char *buf)

{
  int *piVar1;
  int iVar2;
  term_win *ptVar3;
  int iVar4;
  ulong uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t n_00;
  ulong uVar8;
  wchar_t s [1024];
  
  iVar2 = Term->wid;
  text_mbstowcs(s,buf,L'Ѐ');
  ptVar3 = Term->scr;
  if (ptVar3->cu == false) {
    wVar7 = iVar2 + L'\x01';
    if (L'\xffffffff' < n) {
      wVar7 = n;
    }
    uVar5 = 0;
    uVar8 = (ulong)(uint)wVar7;
    if (wVar7 < L'\x01') {
      uVar8 = uVar5;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      if (s[uVar5] == L'\0') {
        uVar8 = uVar5 & 0xffffffff;
        break;
      }
    }
    wVar7 = ptVar3->cx;
    wVar6 = iVar2 - wVar7;
    iVar4 = wVar7 + (wchar_t)uVar8;
    n_00 = (wchar_t)uVar8;
    if (iVar2 <= iVar4) {
      n_00 = wVar6;
    }
    Term_queue_chars(wVar7,ptVar3->cy,n_00,a,s);
    ptVar3 = Term->scr;
    piVar1 = &ptVar3->cx;
    *piVar1 = *piVar1 + n_00;
    wVar7 = L'\0';
    if (wVar6 != L'\0' && iVar2 <= iVar4) {
      ptVar3->cu = true;
      wVar7 = wVar6;
    }
  }
  else {
    wVar7 = L'\xffffffff';
  }
  return wVar7;
}

Assistant:

errr Term_addstr(int n, int a, const char *buf)
{
	int k;

	int w = Term->wid;

	errr res = 0;

	wchar_t s[1024];

	/* Copy to a rewriteable string */
 	text_mbstowcs(s, buf, 1024);

	/* Handle "unusable" cursor */
	if (Term->scr->cu) return (-1);

	/* Obtain maximal length */
	k = (n < 0) ? (w + 1) : n;

	/* Obtain the usable string length */
	for (n = 0; (n < k) && s[n]; n++) /* loop */;

	/* React to reaching the edge of the screen */
	if (Term->scr->cx + n >= w) res = n = w - Term->scr->cx;

	/* Queue the first "n" characters for display */
	Term_queue_chars(Term->scr->cx, Term->scr->cy, n, a, s);

	/* Advance the cursor */
	Term->scr->cx += n;

	/* Hack -- Notice "Useless" cursor */
	if (res) Term->scr->cu = 1;

	/* Success (usually) */
	return (res);
}